

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanInf.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_515e::FloatxNanInfTest_DIV_3_3_simple_inf_Test::TestBody
          (FloatxNanInfTest_DIV_3_3_simple_inf_Test *this)

{
  bool bVar1;
  double dVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  T c;
  T b;
  T a;
  double *in_stack_fffffffffffffee8;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *in_stack_fffffffffffffef0;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  char *in_stack_ffffffffffffff10;
  char *file;
  undefined8 in_stack_ffffffffffffff18;
  Type TVar3;
  AssertHelper *in_stack_ffffffffffffff20;
  AssertionResult local_b0 [2];
  Message *in_stack_ffffffffffffff78;
  AssertHelper *this_00;
  AssertionResult local_70;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_60;
  undefined4 local_4c;
  flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> local_48;
  undefined8 local_38;
  flexfloat local_30 [16];
  undefined8 local_20;
  flexfloat local_18 [24];
  
  TVar3 = (Type)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_20 = 0x3fd5555555555555;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_38 = 0x3f8ffff29406b2a2;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<double>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  local_4c = 0;
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::flexfloat<int>
            (in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8);
  operator/(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  flexfloat<(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator=(&local_48,&local_60);
  flexfloat::operator_cast_to_double(local_18);
  this_00 = (AssertHelper *)0x3fd6000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8,
             (double *)in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    in_stack_fffffffffffffef8 =
         (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x17810c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,TVar3,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=(this_00,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x178160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1781cb);
  flexfloat::operator_cast_to_double(local_30);
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8,
             (int *)in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    in_stack_fffffffffffffef0 =
         (flexfloat<(unsigned_char)__x03_,_(unsigned_char)__x03_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x178245);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,TVar3,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=(this_00,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x178293);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1782f8);
  dVar2 = flexfloat::operator_cast_to_double((flexfloat *)&local_48);
  TVar3 = (Type)((ulong)dVar2 >> 0x20);
  file = (char *)0x7ff0000000000000;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             in_stack_ffffffffffffff00,(double *)in_stack_fffffffffffffef8,
             (double *)in_stack_fffffffffffffef0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff20);
    testing::AssertionResult::failure_message((AssertionResult *)0x17837c);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff20,TVar3,file,in_stack_ffffffffffffff0c,
               in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::operator=(this_00,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffef0);
    testing::Message::~Message((Message *)0x1783c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17842a);
  return;
}

Assistant:

TEST(FloatxNanInfTest, DIV_3_3_simple_inf)
{
    using T = flexfloat<3, 3>;
    T a = 0.33333333333333331483;
    T b =
        (0.03125000000000000000 / 2 -
         1e-7);  // a bit smaller than half of the smallest subnormal in <3,3>
    T c = 0;
    c = a / b;

    // printf("a: 			"); show((fp_t)a);
    // printf("b: 			"); show((fp_t)b);
    // printf("c:   		"); show((fp_t)c);
    // printf("inf: 		"); show((fp_t)inf);

    EXPECT_EQ(fp_t(a), 3.43750000000000000000e-01);
    EXPECT_EQ(fp_t(b), 00000000000000000000);
    EXPECT_EQ(fp_t(c), inf);
}